

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O2

int Abc_EsopAddLits(int *pCover,word r0,word r1,word r2,word Max,int Var)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar5 = (uint)(r1 >> 0x20);
  uVar7 = (uint)(r2 >> 0x20);
  if (Max == r0) {
    if (pCover != (int *)0x0) {
      uVar4 = 0;
      uVar6 = r1 >> 0x20;
      if (uVar5 == 0 || (long)r1 < 0) {
        uVar6 = uVar4;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        pCover[uVar4] = pCover[((long)Max >> 0x20) + uVar4];
      }
      uVar6 = 0;
      uVar4 = 0;
      if (uVar7 != 0 && -1 < (long)r2) {
        uVar4 = (ulong)uVar7;
      }
      for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        uVar5 = pCover[((long)((r1 & 0xffffffff00000000) + Max) >> 0x20) + uVar6];
        uVar1 = Abc_Var2Lit(Var,0);
        pCover[((long)r1 >> 0x20) + uVar6] = uVar5 | 1 << (uVar1 & 0x1f);
      }
    }
  }
  else if (Max == r1) {
    if (pCover != (int *)0x0) {
      uVar6 = 0;
      uVar4 = 0;
      if (uVar7 != 0 && -1 < (long)r2) {
        uVar4 = (ulong)uVar7;
      }
      for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        uVar5 = pCover[((long)((Max & 0xffffffff00000000) + r0) >> 0x20) + uVar6];
        uVar1 = Abc_Var2Lit(Var,1);
        pCover[((long)r0 >> 0x20) + uVar6] = uVar5 | 1 << (uVar1 & 0x1f);
      }
    }
  }
  else {
    iVar2 = (int)(r0 >> 0x20);
    if (pCover != (int *)0x0) {
      uVar4 = 0;
      uVar6 = 0;
      if (0 < iVar2) {
        uVar6 = r0 >> 0x20;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        iVar3 = Abc_Var2Lit(Var,0);
        pCover[uVar4] = pCover[uVar4] | 1 << ((byte)iVar3 & 0x1f);
      }
      uVar4 = 0;
      uVar6 = 0;
      if (uVar5 != 0 && -1 < (long)r1) {
        uVar6 = (ulong)uVar5;
      }
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        iVar3 = Abc_Var2Lit(Var,1);
        pCover[((long)r0 >> 0x20) + uVar4] =
             pCover[((long)r0 >> 0x20) + uVar4] | 1 << ((byte)iVar3 & 0x1f);
      }
    }
    uVar7 = uVar5 + iVar2;
  }
  return uVar7;
}

Assistant:

static inline int Abc_EsopAddLits( int * pCover, word r0, word r1, word r2, word Max, int Var )
{
    int i, c0, c1, c2;
    if ( Max == r0 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c1; i++ )
                pCover[i] = pCover[c0+i];
            for ( i = 0; i < c2; i++ )
                pCover[c1+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,0));
        }
        return c2;
    }
    else if ( Max == r1 )
    {
        c2 = Abc_CostCubes(r2);
        if ( pCover )
        {
            c0 = Abc_CostCubes(r0);
            c1 = Abc_CostCubes(r1);
            for ( i = 0; i < c2; i++ )
                pCover[c0+i] = pCover[c0+c1+i] | (1 << Abc_Var2Lit(Var,1));
        }
        return c2;
    }
    else
    {
        c0 = Abc_CostCubes(r0);
        c1 = Abc_CostCubes(r1);
        if ( pCover )
        {
            c2 = Abc_CostCubes(r2);
            for ( i = 0; i < c0; i++ )
                pCover[i] |= (1 << Abc_Var2Lit(Var,0));
            for ( i = 0; i < c1; i++ )
                pCover[c0+i] |= (1 << Abc_Var2Lit(Var,1));
        }
        return c0 + c1;
    }
}